

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O1

void __thiscall
MathML::AST::ConstantExpression::relationalBinaryOperation
          (ConstantExpression *this,ConstantExpression *result,ConstantExpression *rhs,Operator op)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _func_int *UNRECOVERED_JUMPTABLE;
  String *__rhs;
  ulong uVar3;
  bool bVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Error err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  double local_68;
  undefined **local_60;
  undefined4 local_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar1 = (*(this->super_INode)._vptr_INode[9])();
  if ((iVar1 == 0) || (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 == 0)) {
    if (this->mErrorHandler == (ErrorHandler *)0x0) goto LAB_00845bbc;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"uninitilized operand(s)","");
    local_60 = &PTR__Error_009e2c80;
    local_58 = 0;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_60);
LAB_00845ba0:
    local_60 = &PTR__Error_009e2c80;
    if (local_50[0] == local_40) goto LAB_00845bbc;
LAB_00845baf:
    local_60 = &PTR__Error_009e2c80;
    operator_delete(local_50[0],local_40[0] + 1);
LAB_00845bbc:
    (*(result->super_INode)._vptr_INode[6])(0,result);
    return;
  }
  iVar1 = (*(this->super_INode)._vptr_INode[9])(this);
  if ((iVar1 == 1) || (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 == 1)) {
    iVar1 = (*(this->super_INode)._vptr_INode[9])(this);
    iVar2 = (*(rhs->super_INode)._vptr_INode[9])(rhs);
    if (iVar1 != iVar2) {
      if (this->mErrorHandler == (ErrorHandler *)0x0) goto LAB_00845bbc;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,
                 "not both operands of type boolean for binary comparison operation","");
      local_60 = &PTR__Error_009e2c80;
      local_58 = 0;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_88._M_dataplus._M_p,
                 local_88._M_dataplus._M_p + local_88._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_60);
      goto LAB_00845ba0;
    }
    if (op == NEQ) {
      iVar1 = (*(this->super_INode)._vptr_INode[0xb])(this);
      iVar2 = (*(rhs->super_INode)._vptr_INode[0xb])(rhs);
      uVar3 = (ulong)(CONCAT44(extraout_var_01,iVar1) != CONCAT44(extraout_var_02,iVar2));
    }
    else {
      if (op != EQ) {
        if (this->mErrorHandler == (ErrorHandler *)0x0) goto LAB_00845bbc;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,
                   "boolean operand(s) not allowed for this kind of binary comparision operation",""
                  );
        local_60 = &PTR__Error_009e2c80;
        local_58 = 0;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,local_88._M_dataplus._M_p,
                   local_88._M_dataplus._M_p + local_88._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_60);
        goto LAB_00845ba0;
      }
      iVar1 = (*(this->super_INode)._vptr_INode[0xb])(this);
      iVar2 = (*(rhs->super_INode)._vptr_INode[0xb])(rhs);
      uVar3 = (ulong)(CONCAT44(extraout_var,iVar1) == CONCAT44(extraout_var_00,iVar2));
    }
    goto LAB_00845d99;
  }
  (*(this->super_INode)._vptr_INode[10])(this);
  local_68 = extraout_XMM0_Qa;
  (*(rhs->super_INode)._vptr_INode[10])(rhs);
  switch(op) {
  case EQ:
    bVar4 = local_68 == extraout_XMM0_Qa_00;
    break;
  case NEQ:
    bVar4 = local_68 != extraout_XMM0_Qa_00;
    break;
  case LTE:
    bVar4 = extraout_XMM0_Qa_00 < local_68;
    goto LAB_00845d64;
  case GTE:
    bVar4 = local_68 < extraout_XMM0_Qa_00;
LAB_00845d64:
    uVar3 = (ulong)!bVar4;
LAB_00845d99:
    UNRECOVERED_JUMPTABLE = (result->super_INode)._vptr_INode[8];
    goto LAB_00845da3;
  case LT:
    bVar4 = extraout_XMM0_Qa_00 < local_68;
    goto LAB_00845d95;
  case GT:
    bVar4 = local_68 < extraout_XMM0_Qa_00;
LAB_00845d95:
    uVar3 = (ulong)(!bVar4 && local_68 != extraout_XMM0_Qa_00);
    goto LAB_00845d99;
  default:
    if (this->mErrorHandler == (ErrorHandler *)0x0) goto LAB_00845bbc;
    __rhs = BinaryComparisonExpression::operatorString_abi_cxx11_(op);
    std::operator+(&local_88,"invalid operator: ",__rhs);
    local_60 = &PTR__Error_009e2c80;
    local_58 = 0;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_60);
    local_60 = &PTR__Error_009e2c80;
    if (local_50[0] == local_40) goto LAB_00845bbc;
    goto LAB_00845baf;
  }
  uVar3 = (ulong)(-(uint)bVar4 & 1);
  UNRECOVERED_JUMPTABLE = (result->super_INode)._vptr_INode[8];
LAB_00845da3:
  (*UNRECOVERED_JUMPTABLE)(result,uVar3);
  return;
}

Assistant:

void ConstantExpression::relationalBinaryOperation( ConstantExpression& result, const ConstantExpression& rhs, AST::BinaryComparisonExpression::Operator op ) const
        {
            if ( this->getType() == SCALAR_INVALID || rhs.getType() == SCALAR_INVALID )
            {
                if ( mErrorHandler )
                {
                    Error err( Error::ERR_INVALIDPARAMS, "uninitilized operand(s)" );
                    mErrorHandler->handleError( &err );
                }
                result.setValue( 0. );
                return;
            }

            else if ( this->getType() == SCALAR_BOOL || rhs.getType() == SCALAR_BOOL )
            {
                //check if both bool

                if ( this->getType() != rhs.getType() )
                {
                    if ( mErrorHandler )
                    {
                        Error err( Error::ERR_INVALIDPARAMS, "not both operands of type boolean for binary comparison operation" );
                        mErrorHandler->handleError( &err );
                    }
                    result.setValue( 0. );
                    return;
                }

                // valid ==
                if ( op == AST::BinaryComparisonExpression::EQ )
                {
                    result.setValue( this->getLongValue() == rhs.getLongValue() );
                    return ;
                }

                // valid !=
                else if ( op == AST::BinaryComparisonExpression::NEQ )
                {
                    result.setValue( this->getLongValue() != rhs.getLongValue() );
                    return ;
                }

                //invalid: <, <=, >, ..
                if ( mErrorHandler )
                {
                    Error err( Error::ERR_INVALIDPARAMS, "boolean operand(s) not allowed for this kind of binary comparision operation" );
                    mErrorHandler->handleError( &err );
                }
                result.setValue( 0. );
                return;
            }

            //only double or long values
            else
            {
                double val1 = this->getDoubleValue();
                double val2 = rhs.getDoubleValue();

                switch ( op )
                {

                case AST::BinaryComparisonExpression::EQ:
                    result.setValue( val1 == val2 );
                    return ;

                case AST::BinaryComparisonExpression::NEQ:
                    result.setValue( val1 != val2 );
                    return ;

                case AST::BinaryComparisonExpression::LT:
                    result.setValue( val1 < val2 );
                    return ;

                case AST::BinaryComparisonExpression::LTE:
                    result.setValue( val1 <= val2 );
                    return ;

                case AST::BinaryComparisonExpression::GT:
                    result.setValue( val1 > val2 );
                    return ;

                case AST::BinaryComparisonExpression::GTE:
                    result.setValue( val1 >= val2 );
                    return ;

                default:
                    if ( mErrorHandler )
                    {
                        Error err( Error::ERR_INVALIDPARAMS, "invalid operator: " + AST::BinaryComparisonExpression::operatorString( op ) );
                        mErrorHandler->handleError( &err );
                    }
                    result.setValue( 0. );
                    return;
                }
            }
        }